

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

Ret * __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
insertSpace(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            *this,size_t index,size_t count)

{
  ulong uVar1;
  bool bVar2;
  long in_RDX;
  ulong in_RSI;
  Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_> *in_RDI;
  Ret *dst;
  bool result;
  size_t oldCount;
  size_t in_stack_ffffffffffffffb8;
  ulong local_18;
  Ret *local_8;
  
  uVar1 = (in_RDI->
          super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
          ).m_count;
  bVar2 = setCount(in_RDI,in_stack_ffffffffffffffb8);
  if (bVar2) {
    local_18 = in_RSI;
    if (uVar1 < in_RSI) {
      local_18 = uVar1;
    }
    local_8 = (in_RDI->
              super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
              ).m_p + local_18;
    if ((in_RDX != 0) && (local_18 < uVar1)) {
      ArrayDetails<axl::spy::ThreadState::Ret>::copy
                ((ArrayDetails<axl::spy::ThreadState::Ret> *)(local_8 + in_RDX),
                 (EVP_PKEY_CTX *)local_8,(EVP_PKEY_CTX *)(uVar1 - local_18));
    }
  }
  else {
    local_8 = (Ret *)0x0;
  }
  return local_8;
}

Assistant:

T*
	insertSpace(
		size_t index,
		size_t count
	) {
		size_t oldCount = this->m_count;
		bool result = setCount(this->m_count + count);
		if (!result)
			return NULL;

		if (index > oldCount)
			index = oldCount;

		T* dst = this->m_p + index;

		if (count && index < oldCount)
			Details::copy(dst + count, dst, oldCount - index);

		return dst;
	}